

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Command.h
# Opt level: O3

void __thiscall llbuild::buildsystem::Command::addOutput(Command *this,BuildNode *node)

{
  pointer *pppBVar1;
  pointer *pppCVar2;
  iterator __position;
  iterator __position_00;
  Command *local_20;
  BuildNode *local_18;
  
  __position._M_current =
       (this->outputs).
       super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_18 = node;
  if (__position._M_current ==
      (this->outputs).
      super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<llbuild::buildsystem::BuildNode*,std::allocator<llbuild::buildsystem::BuildNode*>>::
    _M_realloc_insert<llbuild::buildsystem::BuildNode*const&>
              ((vector<llbuild::buildsystem::BuildNode*,std::allocator<llbuild::buildsystem::BuildNode*>>
                *)&this->outputs,__position,&local_18);
  }
  else {
    *__position._M_current = node;
    pppBVar1 = &(this->outputs).
                super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  __position_00._M_current =
       (local_18->super_Node).producers.
       super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (local_18->super_Node).producers.
      super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_20 = this;
    std::vector<llbuild::buildsystem::Command*,std::allocator<llbuild::buildsystem::Command*>>::
    _M_realloc_insert<llbuild::buildsystem::Command*>
              ((vector<llbuild::buildsystem::Command*,std::allocator<llbuild::buildsystem::Command*>>
                *)&(local_18->super_Node).producers,__position_00,&local_20);
  }
  else {
    *__position_00._M_current = this;
    pppCVar2 = &(local_18->super_Node).producers.
                super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppCVar2 = *pppCVar2 + 1;
  }
  return;
}

Assistant:

virtual void addOutput(BuildNode* node) final {
    outputs.push_back(node);
    node->getProducers().push_back(this);
  }